

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void conversion_operator_suite::get_wstring(void)

{
  bool v;
  error *ex_8;
  error *ex_7;
  error *ex_6;
  error *ex_5;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_178 [2];
  error *ex_4;
  error *ex_3;
  error *ex_2;
  error *ex_1;
  error *ex;
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38,L"bravo");
  trial::dynamic::basic_variable::operator_cast_to_nullable((basic_variable *)local_38);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator nullable()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe90,"void conversion_operator_suite::get_wstring()");
  trial::dynamic::basic_variable::operator_cast_to_bool((basic_variable *)local_38);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator bool()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe93,"void conversion_operator_suite::get_wstring()");
  trial::dynamic::basic_variable::operator_cast_to_int((basic_variable *)local_38);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator int()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe96,"void conversion_operator_suite::get_wstring()");
  trial::dynamic::basic_variable::operator_cast_to_float((basic_variable *)local_38);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator float()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe99,"void conversion_operator_suite::get_wstring()");
  trial::dynamic::basic_variable::operator_cast_to_string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ex_4,
             (basic_variable *)local_38);
  std::__cxx11::string::~string((string *)&ex_4);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator variable::string_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe9c,"void conversion_operator_suite::get_wstring()");
  trial::dynamic::basic_variable::operator_cast_to_wstring(local_178,(basic_variable *)local_38);
  v = std::operator==(local_178,L"bravo");
  boost::detail::test_impl
            ("variable::wstring_type(data) == L\"bravo\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe9d,"void conversion_operator_suite::get_wstring()",v);
  std::__cxx11::wstring::~wstring((wstring *)local_178);
  trial::dynamic::basic_variable::operator_cast_to_u16string
            ((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)&ex_5,
             (basic_variable *)local_38);
  std::__cxx11::u16string::~u16string((u16string *)&ex_5);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator variable::u16string_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xea0,"void conversion_operator_suite::get_wstring()");
  trial::dynamic::basic_variable::operator_cast_to_u32string
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)&ex_6,
             (basic_variable *)local_38);
  std::__cxx11::u32string::~u32string((u32string *)&ex_6);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator variable::u32string_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xea3,"void conversion_operator_suite::get_wstring()");
  trial::dynamic::basic_variable::operator_cast_to_vector
            ((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              *)&ex_7,(basic_variable *)local_38);
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::~vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             *)&ex_7);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator variable::array_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xea6,"void conversion_operator_suite::get_wstring()");
  trial::dynamic::basic_variable::operator_cast_to_map
            ((map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
              *)&ex_8,(basic_variable *)local_38);
  std::
  map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  ::~map((map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
          *)&ex_8);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator variable::map_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xea9,"void conversion_operator_suite::get_wstring()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void get_wstring()
{
    variable data(L"bravo");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator nullable(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator bool(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator int(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator float(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::string_type(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST(variable::wstring_type(data) == L"bravo");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::u16string_type(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::u32string_type(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::array_type(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::map_type(),
                                    error,
                                    "incompatible type");
}